

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall
icu_63::double_conversion::Bignum::AssignDecimalString(Bignum *this,Vector<const_char> value)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  char *pcVar8;
  int iVar9;
  
  iVar5 = value.length_;
  if (0 < this->used_digits_) {
    puVar1 = (this->bigits_).start_;
    lVar3 = 0;
    do {
      puVar1[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  uVar6 = 0;
  if (0x12 < iVar5) {
    uVar6 = 0;
    pcVar8 = value.start_;
    iVar9 = iVar5;
    do {
      lVar3 = 0;
      uVar7 = 0;
      do {
        uVar7 = ((long)pcVar8[lVar3] + uVar7 * 10) - 0x30;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x13);
      uVar6 = uVar6 + 0x13;
      iVar5 = iVar9 + -0x13;
      MultiplyByPowerOfTen(this,0x13);
      AddUInt64(this,uVar7);
      pcVar8 = pcVar8 + 0x13;
      bVar2 = 0x25 < iVar9;
      iVar9 = iVar5;
    } while (bVar2);
  }
  if (iVar5 < 1) {
    uVar7 = 0;
  }
  else {
    uVar4 = (ulong)uVar6;
    uVar7 = 0;
    do {
      uVar7 = ((long)value.start_[uVar4] + uVar7 * 10) - 0x30;
      uVar4 = uVar4 + 1;
    } while (uVar4 < iVar5 + uVar6);
  }
  MultiplyByPowerOfTen(this,iVar5);
  AddUInt64(this,uVar7);
  iVar5 = this->used_digits_;
  if ((long)iVar5 < 1) {
    if (iVar5 != 0) {
      return;
    }
  }
  else {
    puVar1 = (this->bigits_).start_;
    uVar4 = (long)iVar5;
    do {
      if (puVar1[uVar4 - 1] != 0) {
        return;
      }
      this->used_digits_ = (int)uVar4 + -1;
      bVar2 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::AssignDecimalString(Vector<const char> value) {
  // 2^64 = 18446744073709551616 > 10^19
  const int kMaxUint64DecimalDigits = 19;
  Zero();
  int length = value.length();
  unsigned int pos = 0;
  // Let's just say that each digit needs 4 bits.
  while (length >= kMaxUint64DecimalDigits) {
    uint64_t digits = ReadUInt64(value, pos, kMaxUint64DecimalDigits);
    pos += kMaxUint64DecimalDigits;
    length -= kMaxUint64DecimalDigits;
    MultiplyByPowerOfTen(kMaxUint64DecimalDigits);
    AddUInt64(digits);
  }
  uint64_t digits = ReadUInt64(value, pos, length);
  MultiplyByPowerOfTen(length);
  AddUInt64(digits);
  Clamp();
}